

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32
png_get_gAMA_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr,png_fixed_point *file_gamma)

{
  png_fixed_point *file_gamma_local;
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if (((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_const_inforp)0x0)) ||
     ((info_ptr->valid & 1) == 0)) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    if (file_gamma != (png_fixed_point *)0x0) {
      *file_gamma = info_ptr->gamma;
    }
    png_ptr_local._4_4_ = 1;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 PNGAPI
png_get_gAMA_fixed(png_const_structrp png_ptr, png_const_inforp info_ptr,
    png_fixed_point *file_gamma)
{
   png_debug1(1, "in %s retrieval function", "gAMA");

   /* PNGv3 compatibility: only report gAMA if it is really present. */
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_gAMA) != 0)
   {
      if (file_gamma != NULL) *file_gamma = info_ptr->gamma;
      return PNG_INFO_gAMA;
   }

   return 0;
}